

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool __thiscall
leveldb::VersionSet::Builder::BySmallestKey::operator()
          (BySmallestKey *this,FileMetaData *f1,FileMetaData *f2)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (*(this->internal_comparator->super_Comparator)._vptr_Comparator[2])();
  if (iVar1 == 0) {
    bVar2 = f1->number < f2->number;
  }
  else {
    bVar2 = SUB41((uint)iVar1 >> 0x1f,0);
  }
  return bVar2;
}

Assistant:

bool operator()(FileMetaData* f1, FileMetaData* f2) const {
      int r = internal_comparator->Compare(f1->smallest, f2->smallest);
      if (r != 0) {
        return (r < 0);
      } else {
        // Break ties by file number
        return (f1->number < f2->number);
      }
    }